

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleDefault(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0xb4;
  id_00.Data4[1] = 0x98;
  id_00.Data4[2] = 0x98;
  id_00.Data4[3] = 0xb4;
  id_00.Data4[4] = '\x17';
  id_00.Data4[5] = '_';
  id_00.Data4[6] = 'e';
  id_00.Data4[7] = 0xfd;
  id_00.Data1 = 0x25b90869;
  id_00.Data2 = 0x22;
  id_00.Data3 = 0x4e04;
  Internal_DimStyleInit(L"Default",-1,id_00,in_RDI);
  Internal_DimStyleDefaultInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleDefault()
{
  const ON_UUID id =
  { 0x25b90869, 0x22, 0x4e04,{ 0xb4, 0x98, 0x98, 0xb4, 0x17, 0x5f, 0x65, 0xfd } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Default", -1, id, dimstyle);
  Internal_DimStyleDefaultInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}